

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tar_filenames.c
# Opt level: O1

void test_filename(char *prefix,int dlen,int flen)

{
  int iVar1;
  mode_t mVar2;
  size_t sVar3;
  long lVar4;
  archive *paVar5;
  char *pcVar6;
  longlong lVar7;
  wchar_t wVar8;
  int iVar9;
  uint uVar10;
  archive_entry *ae;
  size_t used;
  char filename [400];
  char dirname [400];
  char buff [8192];
  archive_entry *local_2368;
  size_t local_2360;
  char local_2358 [400];
  char local_21c8 [400];
  undefined1 local_2038 [8200];
  
  iVar1 = 0;
  uVar10 = 0;
  if (prefix != (char *)0x0) {
    strcpy(local_2358,prefix);
    sVar3 = strlen(prefix);
    uVar10 = (uint)sVar3;
  }
  if (0 < dlen) {
    if ((int)uVar10 < dlen) {
      memset(local_2358 + (int)uVar10,0x61,(ulong)(~uVar10 + dlen) + 1);
      lVar4 = 0;
      do {
        lVar4 = lVar4 + -1;
      } while ((long)(int)uVar10 - (ulong)(uint)dlen != lVar4);
      uVar10 = uVar10 - (int)lVar4;
    }
    lVar4 = (long)(int)uVar10;
    uVar10 = uVar10 + 1;
    local_2358[lVar4] = '/';
    iVar1 = 1;
  }
  iVar9 = flen + dlen + iVar1;
  if ((int)uVar10 < iVar9) {
    lVar4 = (long)(int)uVar10;
    memset(local_2358 + lVar4,0x62,(ulong)(~uVar10 + iVar1 + flen + dlen) + 1);
    do {
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar9);
    uVar10 = (uint)lVar4;
  }
  local_2358[(int)uVar10] = '\0';
  strcpy(local_21c8,local_2358);
  paVar5 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'<',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'=',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",paVar5);
  iVar1 = archive_write_add_filter_none(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'>',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar5);
  iVar1 = archive_write_set_bytes_per_block(paVar5,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'?',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a,0)",paVar5);
  iVar1 = archive_write_open_memory(paVar5,local_2038,0x2000,&local_2360);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'@',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar5);
  local_2368 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'E',(uint)(local_2368 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_2368,local_2358);
  archive_entry_set_mode(local_2368,0x81ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_write_header(paVar5,local_2368);
  if (flen < 0x65) {
    pcVar6 = "0";
    wVar8 = L'L';
    lVar7 = 0;
  }
  else {
    pcVar6 = "ARCHIVE_FAILED";
    wVar8 = L'J';
    lVar7 = -0x19;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,wVar8,lVar7,pcVar6,(long)iVar1,"archive_write_header(a, ae)",paVar5);
  archive_entry_free(local_2368);
  local_2368 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'S',(uint)(local_2368 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_2368,local_21c8);
  archive_entry_set_mode(local_2368,0x41ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_write_header(paVar5,local_2368);
  if (flen < 100) {
    pcVar6 = "0";
    wVar8 = L'Z';
    lVar7 = 0;
  }
  else {
    pcVar6 = "ARCHIVE_FAILED";
    wVar8 = L'X';
    lVar7 = -0x19;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,wVar8,lVar7,pcVar6,(long)iVar1,"archive_write_header(a, ae)",paVar5);
  archive_entry_free(local_2368);
  sVar3 = strlen(local_21c8);
  (local_21c8 + sVar3)[0] = '/';
  (local_21c8 + sVar3)[1] = '\0';
  local_2368 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'd',(uint)(local_2368 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_2368,local_21c8);
  archive_entry_set_mode(local_2368,0x41ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_write_header(paVar5,local_2368);
  if (flen < 100) {
    pcVar6 = "0";
    wVar8 = L'k';
    lVar7 = 0;
  }
  else {
    pcVar6 = "ARCHIVE_FAILED";
    wVar8 = L'i';
    lVar7 = -0x19;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,wVar8,lVar7,pcVar6,(long)iVar1,"archive_write_header(a, ae)",paVar5);
  archive_entry_free(local_2368);
  iVar1 = archive_write_close(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
  iVar1 = archive_write_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar5 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'v',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'w',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",paVar5);
  iVar1 = archive_read_support_filter_all(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'x',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",paVar5);
  iVar1 = archive_read_open_memory(paVar5,local_2038,local_2360);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'y',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buff, used)",paVar5);
  if (flen < 0x65) {
    iVar1 = archive_read_next_header(paVar5,&local_2368);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'}',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar5);
    failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
    pcVar6 = archive_entry_pathname(local_2368);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
               ,L'\x7f',local_2358,"filename",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
    ;
    mVar2 = archive_entry_mode(local_2368);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                        ,L'\x80',0x81ed,"(S_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (flen < 100) {
    iVar1 = archive_read_next_header(paVar5,&local_2368);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'\x8b',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar5);
    mVar2 = archive_entry_mode(local_2368);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'\x8c',(uint)(mVar2 == 0x41ed),"(S_IFDIR | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
    pcVar6 = archive_entry_pathname(local_2368);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
               ,L'\x8e',local_21c8,"dirname",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar1 = archive_read_next_header(paVar5,&local_2368);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'\x92',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar5);
    mVar2 = archive_entry_mode(local_2368);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'\x93',(uint)(mVar2 == 0x41ed),"(S_IFDIR | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    pcVar6 = archive_entry_pathname(local_2368);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
               ,L'\x94',local_21c8,"dirname",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  }
  failure("This fails if entries were written that should not have been written.  dlen=%d, flen=%d",
          (ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_read_next_header(paVar5,&local_2368);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x99',1,"1",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  iVar1 = archive_read_close(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x9a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
  iVar1 = archive_read_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x9b',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_filename(const char *prefix, int dlen, int flen)
{
	char buff[8192];
	char filename[400];
	char dirname[400];
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	char *p;
	int i;

	p = filename;
	if (prefix) {
		strcpy(filename, prefix);
		p += strlen(p);
	}
	if (dlen > 0) {
		for (i = 0; i < dlen; i++)
			*p++ = 'a';
		*p++ = '/';
	}
	for (i = 0; i < flen; i++)
		*p++ = 'b';
	*p = '\0';

	strcpy(dirname, filename);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_pax_restricted(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a,0));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, filename);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	failure("Pathname %d/%d", dlen, flen);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write a dir to it (without trailing '/').
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, dirname);
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	failure("Dirname %d/%d", dlen, flen);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Tar adds a '/' to directory names. */
	strcat(dirname, "/");

	/*
	 * Write a dir to it (with trailing '/').
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, dirname);
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	failure("Dirname %d/%d", dlen, flen);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, used));

	/* Read the file and check the filename. */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString(filename, archive_entry_pathname(ae));
	assertEqualInt((S_IFREG | 0755), archive_entry_mode(ae));

	/*
	 * Read the two dirs and check the names.
	 *
	 * Both dirs should read back with the same name, since
	 * tar should add a trailing '/' to any dir that doesn't
	 * already have one.  We only report the first such failure
	 * here.
	 */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString(dirname, archive_entry_pathname(ae));
	assert((S_IFDIR | 0755) == archive_entry_mode(ae));

	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString(dirname, archive_entry_pathname(ae));
	assert((S_IFDIR | 0755) == archive_entry_mode(ae));

	/* Verify the end of the archive. */
	assert(1 == archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}